

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_enumerator.cpp
# Opt level: O2

EnumerationConstraint * __thiscall
Clasp::CBConsequences::doInit
          (CBConsequences *this,SharedContext *ctx,SharedMinimizeData *m,int param_3)

{
  byte bVar1;
  uint uVar2;
  Algo AVar3;
  uint uVar4;
  pointer pLVar5;
  pointer pVVar6;
  SharedConstraint *this_00;
  CBFinder *this_01;
  SharedCon *sh;
  Literal p;
  uint v;
  int iVar7;
  ulong uVar8;
  pointer pPVar9;
  long lVar10;
  bool bVar11;
  byte local_3c;
  
  (this->cons_).ebo_.size = 0;
  uVar8 = (ulong)(ctx->output).proj_.ebo_.size;
  iVar7 = (ctx->output).projMode_;
  bVar11 = uVar8 == 0;
  if (iVar7 != 0) {
    bVar11 = iVar7 == 1;
  }
  if (bVar11) {
    if ((ctx->output).facts_.ebo_.size != 0) {
      addLit(this,ctx,(Literal)0x0);
    }
    pPVar9 = (ctx->output).preds_.ebo_.buf;
    for (lVar10 = (ulong)(ctx->output).preds_.ebo_.size << 4; lVar10 != 0; lVar10 = lVar10 + -0x10)
    {
      addLit(this,ctx,(Literal)(pPVar9->cond).rep_);
      pPVar9 = pPVar9 + 1;
    }
    uVar2 = (ctx->output).vars_.lo;
    iVar7 = (ctx->output).vars_.hi - uVar2;
    p.rep_ = uVar2 << 2;
    while (bVar11 = iVar7 != 0, iVar7 = iVar7 + -1, bVar11) {
      addLit(this,ctx,p);
      p.rep_ = p.rep_ + 4;
    }
  }
  else {
    pLVar5 = (ctx->output).proj_.ebo_.buf;
    for (lVar10 = 0; uVar8 << 2 != lVar10; lVar10 = lVar10 + 4) {
      addLit(this,ctx,(Literal)*(uint32 *)((long)&pLVar5->rep_ + lVar10));
    }
  }
  if (m != (SharedMinimizeData *)0x0) {
    bVar11 = SharedMinimizeData::optimize(m);
    if ((bVar11) && (this->algo_ == Query)) {
      SharedContext::warn(ctx,"Query algorithm does not support optimization!");
      this->algo_ = Default;
    }
  }
  bVar11 = this->type_ == Cautious;
  AVar3 = this->algo_;
  local_3c = bVar11 * '\x03';
  pLVar5 = (this->cons_).ebo_.buf;
  uVar2 = (this->cons_).ebo_.size;
  for (lVar10 = 0; (ulong)uVar2 << 2 != lVar10; lVar10 = lVar10 + 4) {
    uVar4 = *(uint *)((long)&pLVar5->rep_ + lVar10);
    *(uint *)((long)&pLVar5->rep_ + lVar10) = uVar4 | (AVar3 != Query && bVar11);
    v = uVar4 >> 2;
    pVVar6 = (ctx->varInfo_).ebo_.buf;
    bVar1 = pVVar6[v].rep;
    pVVar6[v].rep = bVar1 & 0xfc;
    if ((bVar1 & 0x20) == 0) {
      Solver::setPref(*(ctx->solvers_).ebo_.buf,v,def_value,2U - ((uVar4 & 2) == 0) ^ local_3c);
    }
  }
  this_00 = this->shared_;
  if (this_00 != (SharedConstraint *)0x0) {
    SharedConstraint::~SharedConstraint(this_00);
  }
  operator_delete(this_00);
  this->shared_ = (SharedConstraint *)0x0;
  Enumerator::setIgnoreSymmetric(&this->super_Enumerator,true);
  if ((this->type_ == Cautious) && (this->algo_ == Query)) {
    this_01 = (CBFinder *)operator_new(0x60);
    QueryFinder::QueryFinder((QueryFinder *)this_01,&this->cons_,(ctx->varInfo_).ebo_.size);
  }
  else {
    sh = (SharedCon *)0x0;
    if (((uint)ctx->share_ & 0x3fe) != 0) {
      sh = (SharedCon *)operator_new(0x10);
      sh->current = (SharedLiterals *)0x0;
      LOCK();
      (sh->mutex).super___atomic_base<int>._M_i = 0;
      UNLOCK();
    }
    this->shared_ = sh;
    this_01 = (CBFinder *)operator_new(0x70);
    CBFinder::CBFinder(this_01,sh);
  }
  return &this_01->super_EnumerationConstraint;
}

Assistant:

EnumerationConstraint* CBConsequences::doInit(SharedContext& ctx, SharedMinimizeData* m, int) {
	cons_.clear();
	const OutputTable& out = ctx.output;
	if (out.projectMode() == ProjectMode_t::Output) {
		if (out.numFacts()) {
			addLit(ctx, lit_true());
		}
		for (OutputTable::pred_iterator it = out.pred_begin(), end = out.pred_end(); it != end; ++it) {
			addLit(ctx, it->cond);
		}
		for (OutputTable::range_iterator it = out.vars_begin(), end = out.vars_end(); it != end; ++it) {
			addLit(ctx, posLit(*it));
		}
	}
	else {
		for (OutputTable::lit_iterator it = out.proj_begin(), end = out.proj_end(); it != end; ++it) {
			addLit(ctx, *it);
		}
	}
	if (m && m->optimize() && algo_ == Query) {
		ctx.warn("Query algorithm does not support optimization!");
		algo_ = Default;
	}
	// init M to either cons or {} depending on whether we compute cautious or brave cons.
	const uint32 fMask = (type_ == Cautious && algo_ != Query);
	const uint32 vMask = (type_ == Cautious) ? 3u : 0u;
	for (LitVec::iterator it = cons_.begin(), end = cons_.end(); it != end; ++it) {
		it->rep() |= fMask;
		ctx.unmark(it->var());
		if (!ctx.varInfo(it->var()).nant()) {
			ctx.master()->setPref(it->var(), ValueSet::def_value, static_cast<ValueRep>(trueValue(*it) ^ vMask));
		}
	}
	delete shared_; shared_ = 0;
	setIgnoreSymmetric(true);
	if (type_ != Cautious || algo_ != Query) {
		shared_ = ctx.concurrency() > 1 ? new SharedConstraint() : 0;
		return new CBFinder(shared_);
	}
	return new QueryFinder(cons_, ctx.numVars() + 1);
}